

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.hpp
# Opt level: O0

void __thiscall
libtest::printer::cprintln<std::__cxx11::string>
          (printer *this,ansi_sgr *command,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  ostream *poVar1;
  ansi_sgr local_78;
  string local_70;
  string local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  ansi_sgr *command_local;
  printer *this_local;
  
  poVar1 = this->os;
  local_20 = args;
  args_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)command;
  command_local = (ansi_sgr *)this;
  ansi_sgr::to_string_abi_cxx11_(&local_40,command);
  std::operator<<(poVar1,(string *)&local_40);
  println<std::__cxx11::string>(this,args);
  poVar1 = this->os;
  ansi_sgr::ansi_sgr(&local_78,white,reset);
  ansi_sgr::to_string_abi_cxx11_(&local_70,&local_78);
  std::operator<<(poVar1,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void cprintln(const ansi_sgr& command, Args... args) { os << command.to_string(), println(args...), os << ansi_sgr{}.to_string(); }